

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locmap.cpp
# Opt level: O3

uint32_t uprv_convertToLCID_63(char *langID,char *posixID,UErrorCode *status)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  size_t sVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  UErrorCode myStatus;
  UErrorCode local_3c;
  UErrorCode *local_38;
  
  uVar3 = 0;
  if (((posixID != (char *)0x0 && langID != (char *)0x0) &&
      (sVar4 = strlen(langID), uVar3 = 0, 1 < sVar4)) && (sVar4 = strlen(posixID), 1 < sVar4)) {
    uVar10 = 0x8d;
    uVar5 = 0;
    uVar7 = 0;
    local_38 = status;
    do {
      uVar8 = uVar5 + uVar10 >> 1;
      if (uVar8 == uVar7) break;
      iVar1 = strcmp(langID,(gPosixIDmap[uVar8].regionMaps)->posixID);
      uVar7 = uVar8;
      if ((-1 < iVar1) && (uVar5 = uVar8, uVar7 = uVar10, iVar1 == 0)) {
        uVar3 = getHostID(gPosixIDmap + uVar8,posixID,local_38);
        return uVar3;
      }
      uVar10 = uVar7;
      uVar7 = uVar8;
    } while (uVar5 < uVar10);
    lVar6 = 0;
    uVar9 = 0xffffffff;
    do {
      local_3c = U_ZERO_ERROR;
      uVar2 = getHostID((ILcidPosixMap *)((long)&gPosixIDmap[0].numRegions + lVar6),posixID,
                        &local_3c);
      uVar3 = uVar2;
      if ((local_3c != U_ERROR_WARNING_START) && (uVar3 = uVar9, local_3c == U_ZERO_ERROR)) {
        return uVar2;
      }
      lVar6 = lVar6 + 0x10;
      uVar9 = uVar3;
    } while (lVar6 != 0x8d0);
    if (uVar3 == 0xffffffff) {
      *local_38 = U_ILLEGAL_ARGUMENT_ERROR;
      uVar3 = 0;
    }
    else {
      *local_38 = U_ERROR_WARNING_START;
    }
  }
  return uVar3;
}

Assistant:

U_CAPI uint32_t
uprv_convertToLCID(const char *langID, const char* posixID, UErrorCode* status)
{
    // This function does the table lookup when native platform name->lcid conversion isn't available,
    // or for locales that don't follow patterns the platform expects.
    uint32_t   low    = 0;
    uint32_t   high   = gLocaleCount;
    uint32_t   mid;
    uint32_t   oldmid = 0;
    int32_t    compVal;

    uint32_t   value         = 0;
    uint32_t   fallbackValue = (uint32_t)-1;
    UErrorCode myStatus;
    uint32_t   idx;

    /* Check for incomplete id. */
    if (!langID || !posixID || uprv_strlen(langID) < 2 || uprv_strlen(posixID) < 2) {
        return 0;
    }

    /*Binary search for the map entry for normal cases */

    while (high > low)  /*binary search*/{

        mid = (high+low) >> 1; /*Finds median*/

        if (mid == oldmid) 
            break;

        compVal = uprv_strcmp(langID, gPosixIDmap[mid].regionMaps->posixID);
        if (compVal < 0){
            high = mid;
        }
        else if (compVal > 0){
            low = mid;
        }
        else /*we found it*/{
            return getHostID(&gPosixIDmap[mid], posixID, status);
        }
        oldmid = mid;
    }

    /*
     * Sometimes we can't do a binary search on posixID because some LCIDs
     * go to different locales.  We hit one of those special cases.
     */
    for (idx = 0; idx < gLocaleCount; idx++ ) {
        myStatus = U_ZERO_ERROR;
        value = getHostID(&gPosixIDmap[idx], posixID, &myStatus);
        if (myStatus == U_ZERO_ERROR) {
            return value;
        }
        else if (myStatus == U_USING_FALLBACK_WARNING) {
            fallbackValue = value;
        }
    }

    if (fallbackValue != (uint32_t)-1) {
        *status = U_USING_FALLBACK_WARNING;
        return fallbackValue;
    }

    /* no match found */
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;   /* return international (root) */
}